

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDfs.c
# Opt level: O0

void Ivy_ManCollectCone_rec(Ivy_Obj_t *pObj,Vec_Ptr_t *vCone)

{
  int iVar1;
  Ivy_Obj_t *pIVar2;
  Vec_Ptr_t *vCone_local;
  Ivy_Obj_t *pObj_local;
  
  if ((*(uint *)&pObj->field_0x8 >> 4 & 1) == 0) {
    iVar1 = Ivy_ObjIsBuf(pObj);
    if (iVar1 == 0) {
      iVar1 = Ivy_ObjIsNode(pObj);
      if (iVar1 == 0) {
        __assert_fail("Ivy_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyDfs.c"
                      ,0xb2,"void Ivy_ManCollectCone_rec(Ivy_Obj_t *, Vec_Ptr_t *)");
      }
      pIVar2 = Ivy_ObjFanin0(pObj);
      Ivy_ManCollectCone_rec(pIVar2,vCone);
      pIVar2 = Ivy_ObjFanin1(pObj);
      Ivy_ManCollectCone_rec(pIVar2,vCone);
      Vec_PtrPushUnique(vCone,pObj);
    }
    else {
      pIVar2 = Ivy_ObjFanin0(pObj);
      Ivy_ManCollectCone_rec(pIVar2,vCone);
      Vec_PtrPush(vCone,pObj);
    }
  }
  return;
}

Assistant:

void Ivy_ManCollectCone_rec( Ivy_Obj_t * pObj, Vec_Ptr_t * vCone )
{
    if ( pObj->fMarkA )
        return;
    if ( Ivy_ObjIsBuf(pObj) )
    {
        Ivy_ManCollectCone_rec( Ivy_ObjFanin0(pObj), vCone );
        Vec_PtrPush( vCone, pObj );
        return;
    }
    assert( Ivy_ObjIsNode(pObj) );
    Ivy_ManCollectCone_rec( Ivy_ObjFanin0(pObj), vCone );
    Ivy_ManCollectCone_rec( Ivy_ObjFanin1(pObj), vCone );
    Vec_PtrPushUnique( vCone, pObj );
}